

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_build_backward_expand
               (ggml_context *ctx_static,ggml_context *ctx_compute,ggml_cgraph *cgraph,
               _Bool accumulate)

{
  ggml_hash_set *hash_set;
  _Bool *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *key;
  ggml_tensor *key_00;
  ggml_tensor *key_01;
  ulong uVar5;
  FILE *__stream;
  _Bool _Var6;
  uint uVar7;
  ggml_unary_op gVar8;
  void *__ptr;
  size_t sVar9;
  ggml_tensor *pgVar10;
  size_t isrc;
  size_t sVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  byte bVar14;
  char *pcVar15;
  uint uVar16;
  ulong nb1;
  byte bVar17;
  int iVar18;
  byte bVar19;
  char cVar20;
  ulong in_R8;
  ulong uVar21;
  long lVar22;
  long lVar23;
  int i;
  long lVar24;
  ulong nb3;
  bool bVar25;
  float s;
  byte local_c4;
  undefined8 local_a0;
  undefined4 local_94;
  ulong local_90;
  _Bool ignore_src [10];
  int iStack_7c;
  
  lVar22 = (long)cgraph->n_nodes;
  if (lVar22 < 1) {
    pcVar15 = "cgraph->n_nodes > 0";
    iVar18 = 0x16c0;
  }
  else if (cgraph->grads == (ggml_tensor **)0x0) {
    pcVar15 = "cgraph->grads";
    iVar18 = 0x16c1;
  }
  else if (cgraph->grad_accs == (ggml_tensor **)0x0) {
    pcVar15 = "cgraph->grad_accs";
    iVar18 = 0x16c2;
  }
  else {
    hash_set = &cgraph->visited_hash_set;
    memset(cgraph->grads,0,(cgraph->visited_hash_set).size << 3);
    memset(cgraph->grad_accs,0,(cgraph->visited_hash_set).size << 3);
    __ptr = calloc((cgraph->visited_hash_set).size,1);
    bVar14 = 0;
    bVar19 = 0;
    for (lVar24 = 0; lVar22 != lVar24; lVar24 = lVar24 + 1) {
      bVar17 = 1;
      bVar25 = bVar14 == 0;
      bVar14 = 1;
      if (bVar25) {
        bVar14 = ((byte)cgraph->nodes[lVar24]->flags & 4) >> 2;
      }
      if (bVar19 == 0) {
        bVar17 = ((byte)cgraph->nodes[lVar24]->flags & 8) >> 3;
      }
      bVar19 = bVar17;
    }
    if (bVar14 == 0) {
      pcVar15 = 
      "any_params && \"no trainable parameters found, did you forget to call ggml_set_param?\"";
      iVar18 = 0x16d2;
    }
    else {
      if (bVar19 != 0) {
        for (lVar24 = 0; lVar24 != lVar22; lVar24 = lVar24 + 1) {
          pgVar12 = cgraph->nodes[lVar24];
          if (pgVar12->type != GGML_TYPE_I32) {
            uVar16 = pgVar12->flags;
            stack0xffffffffffffff80 = stack0xffffffffffffff80 & 0xffffffffffff0000;
            ignore_src[0] = false;
            ignore_src[1] = false;
            ignore_src[2] = false;
            ignore_src[3] = false;
            ignore_src[4] = false;
            ignore_src[5] = false;
            ignore_src[6] = false;
            ignore_src[7] = false;
            uVar7 = pgVar12->op - GGML_OP_CPY;
            uVar21 = (ulong)uVar7;
            if (uVar7 < 0x2b) {
              if ((0x20c1UL >> (uVar21 & 0x3f) & 1) == 0) {
                if (((0x60000UL >> (uVar21 & 0x3f) & 1) != 0) ||
                   ((uVar21 == 0x2a &&
                    (gVar8 = ggml_get_unary_op(pgVar12),
                    (gVar8 & ~GGML_UNARY_OP_NEG) == GGML_UNARY_OP_SGN)))) {
                  ignore_src[0] = true;
                }
              }
              else {
                ignore_src[0] = false;
                ignore_src[1] = true;
                ignore_src[2] = false;
                ignore_src[3] = false;
                ignore_src[4] = false;
                ignore_src[5] = false;
                ignore_src[6] = false;
                ignore_src[7] = false;
              }
            }
            for (lVar23 = 0x13; lVar23 != 0x1d; lVar23 = lVar23 + 1) {
              pgVar10 = (ggml_tensor *)pgVar12->ne[lVar23 + -2];
              if (((pgVar10 != (ggml_tensor *)0x0) &&
                  (*(char *)((long)&local_a0 + lVar23 + 5) == '\0')) &&
                 (sVar9 = ggml_hash_find(hash_set,pgVar10), *(char *)((long)__ptr + sVar9) == '\x01'
                 )) {
                if (pgVar10->type < GGML_TYPE_Q4_0) goto LAB_00125b3f;
                pcVar15 = 
                "node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16";
                iVar18 = 0x16fc;
                goto LAB_00127195;
              }
            }
            if ((uVar16 & 0xc) != 0) {
LAB_00125b3f:
              if ((pgVar12->view_src != (ggml_tensor *)0x0) &&
                 ((0x25 < (ulong)pgVar12->op ||
                  ((0x3d00000000U >> ((ulong)pgVar12->op & 0x3f) & 1) == 0)))) {
                pcVar15 = 
                "!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW || node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE"
                ;
                iVar18 = 0x1706;
                goto LAB_00127195;
              }
              sVar9 = ggml_hash_find(hash_set,pgVar12);
              if (sVar9 == 0xffffffffffffffff) {
                pcVar15 = "igrad != GGML_HASHSET_FULL";
                iVar18 = 0x1709;
                goto LAB_00127195;
              }
              if (((cgraph->visited_hash_set).used[sVar9 >> 5] >> ((uint)sVar9 & 0x1f) & 1) == 0) {
                pcVar15 = "ggml_bitset_get(cgraph->visited_hash_set.used, igrad)";
                iVar18 = 0x170a;
                goto LAB_00127195;
              }
              if ((pgVar12->flags & 4U) != 0 && accumulate || (pgVar12->flags & 8U) != 0) {
                pgVar10 = ggml_dup_tensor(ctx_static,pgVar12);
                cgraph->grad_accs[sVar9] = pgVar10;
                cgraph->grads[sVar9] = cgraph->grad_accs[sVar9];
                ggml_format_name(cgraph->grad_accs[sVar9],"grad acc for %s",pgVar12->name);
              }
              *(undefined1 *)((long)__ptr + sVar9) = 1;
            }
          }
        }
        do {
          sVar9 = 0xffffffffffffffff;
          if (lVar22 < 1) {
            free(__ptr);
            return;
          }
          pgVar12 = cgraph->nodes[lVar22 + -1];
          pgVar10 = ggml_graph_get_grad(cgraph,pgVar12);
          if (pgVar10 == (ggml_tensor *)0x0) goto LAB_00126ba3;
          key = pgVar12->src[0];
          key_00 = pgVar12->src[1];
          key_01 = pgVar12->src[2];
          isrc = sVar9;
          if (key != (ggml_tensor *)0x0) {
            isrc = ggml_hash_find(hash_set,key);
          }
          sVar11 = sVar9;
          if (key_00 != (ggml_tensor *)0x0) {
            sVar11 = ggml_hash_find(hash_set,key_00);
          }
          local_a0 = sVar11;
          if (key_01 != (ggml_tensor *)0x0) {
            sVar9 = ggml_hash_find(hash_set,key_01);
          }
          if ((isrc == 0xffffffffffffffff || key == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[isrc >> 5] >> ((uint)isrc & 0x1f) & 1) == 0)) {
            in_R8 = 0;
          }
          else {
            in_R8 = CONCAT71((int7)(in_R8 >> 8),*(undefined1 *)((long)__ptr + isrc));
          }
          if ((local_a0 == 0xffffffffffffffff || key_00 == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[local_a0 >> 5] >> ((uint)local_a0 & 0x1f) & 1) == 0))
          {
            local_c4 = 0;
          }
          else {
            local_c4 = *(byte *)((long)__ptr + local_a0);
          }
          if ((sVar9 == 0xffffffffffffffff || key_01 == (ggml_tensor *)0x0) ||
             (((cgraph->visited_hash_set).used[sVar9 >> 5] >> ((uint)sVar9 & 0x1f) & 1) == 0)) {
            local_94 = 0;
          }
          else {
            local_94 = (undefined4)
                       CONCAT71((int7)((ulong)__ptr >> 8),*(undefined1 *)((long)__ptr + sVar9));
          }
          bVar19 = (byte)in_R8;
          switch((ulong)pgVar12->op) {
          case 0:
            goto switchD_00125dbd_caseD_0;
          case 1:
          case 0x20:
            if (bVar19 == 0) break;
LAB_0012692e:
            ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
            goto LAB_00126b30;
          case 2:
            if (bVar19 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
              in_R8 = in_R8 & 0xffffffff;
            }
            if (local_c4 != 0) {
              in_R8 = in_R8 & 0xffffffff;
              _Var6 = ggml_are_same_shape(key,key_00);
              if (!_Var6) {
                pgVar10 = ggml_repeat_back(ctx_compute,pgVar10,key_00);
              }
              ggml_add_or_set(ctx_compute,cgraph,local_a0,pgVar10);
            }
            goto switchD_00125dbd_caseD_0;
          case 3:
            if (bVar19 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
              in_R8 = in_R8 & 0xffffffff;
            }
            uVar16 = (uint)in_R8;
            if (local_c4 != 0) {
              pgVar12 = ggml_mean(ctx_compute,pgVar10);
LAB_00126b0e:
              ggml_add_or_set(ctx_compute,cgraph,local_a0,pgVar12);
LAB_00126b1e:
              in_R8 = (ulong)uVar16;
            }
            goto switchD_00125dbd_caseD_0;
          case 4:
            if (bVar19 != 0) {
              in_R8 = in_R8 & 0xffffffff;
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
            }
            if (local_c4 != 0) {
              pgVar12 = ggml_view_4d(ctx_compute,pgVar10,key_00->ne[0],key_00->ne[1],key_00->ne[2],
                                     key_00->ne[3],(long)pgVar12->op_params[0],
                                     (long)pgVar12->op_params[1],(long)pgVar12->op_params[2],
                                     (long)pgVar12->op_params[3]);
              pgVar12 = ggml_cont(ctx_compute,pgVar12);
              pgVar12 = ggml_reshape(ctx_compute,pgVar12,key_00);
LAB_001265ac:
              in_R8 = in_R8 & 0xffffffff;
              ggml_add_or_set(ctx_compute,cgraph,local_a0,pgVar12);
            }
            goto switchD_00125dbd_caseD_0;
          case 5:
            if (bVar19 != 0) {
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
              in_R8 = in_R8 & 0xffffffff;
            }
            if (local_c4 != 0) {
              uVar16 = (uint)in_R8;
LAB_00126222:
              ggml_sub_or_set(ctx_compute,cgraph,local_a0,pgVar10);
              goto LAB_00126b1e;
            }
            goto switchD_00125dbd_caseD_0;
          case 6:
            if (bVar19 != 0) {
              pgVar12 = ggml_mul(ctx_compute,pgVar10,key_00);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar12);
              in_R8 = in_R8 & 0xffffffff;
            }
            if (local_c4 != 0) {
              local_90 = CONCAT44(local_90._4_4_,(int)in_R8);
              pgVar12 = ggml_mul(ctx_compute,key,pgVar10);
              _Var6 = ggml_are_same_shape(key,key_00);
              if (!_Var6) {
                pgVar12 = ggml_repeat_back(ctx_compute,pgVar12,key_00);
              }
              ggml_add_or_set(ctx_compute,cgraph,local_a0,pgVar12);
              in_R8 = local_90 & 0xffffffff;
            }
            goto switchD_00125dbd_caseD_0;
          case 7:
            if (bVar19 != 0) {
              in_R8 = in_R8 & 0xffffffff;
              pgVar13 = ggml_div(ctx_compute,pgVar10,key_00);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar13);
            }
            if (local_c4 != 0) {
              uVar16 = (uint)in_R8;
              pgVar12 = ggml_div(ctx_compute,pgVar12,key_00);
              pgVar10 = ggml_mul(ctx_compute,pgVar10,pgVar12);
              goto LAB_00126222;
            }
            goto switchD_00125dbd_caseD_0;
          case 8:
            if (bVar19 != 0) {
              pgVar12 = ggml_mul(ctx_compute,key,pgVar10);
              s = 2.0;
LAB_00126141:
              pgVar10 = ggml_scale(ctx_compute,pgVar12,s);
              goto LAB_0012692e;
            }
            break;
          case 9:
            if (bVar19 != 0) {
              pgVar12 = ggml_div(ctx_compute,pgVar10,pgVar12);
              s = 0.5;
              goto LAB_00126141;
            }
            break;
          case 10:
            if (bVar19 != 0) {
              pgVar10 = ggml_div(ctx_compute,pgVar10,key);
              goto LAB_0012692e;
            }
            break;
          case 0xb:
            if (bVar19 != 0) {
              pgVar13 = ggml_cos(ctx_compute,key);
              pgVar12 = pgVar10;
              goto LAB_00126919;
            }
            break;
          case 0xc:
            if (bVar19 != 0) {
              pgVar12 = ggml_sin(ctx_compute,key);
              pgVar10 = ggml_mul(ctx_compute,pgVar10,pgVar12);
LAB_001268ea:
              ggml_sub_or_set(ctx_compute,cgraph,isrc,pgVar10);
              goto LAB_00126b30;
            }
            break;
          case 0xd:
            if (bVar19 != 0) {
LAB_00126355:
              ggml_add1_or_set(ctx_compute,cgraph,isrc,pgVar10);
              goto LAB_00126b30;
            }
            break;
          case 0xe:
          case 0x13:
            if (bVar19 != 0) {
              pgVar10 = ggml_repeat(ctx_compute,pgVar10,key);
              goto LAB_0012692e;
            }
            break;
          case 0xf:
            if (bVar19 != 0) {
              pgVar10 = ggml_scale_impl(ctx_compute,pgVar10,1.0 / (float)key->ne[0],false);
              goto LAB_00126355;
            }
            break;
          default:
            fprintf(_stderr,"%s: unsupported ggml op for backward pass: %s\n",
                    "ggml_compute_backward",GGML_OP_NAME[pgVar12->op]);
            iVar18 = 0x1675;
LAB_00127069:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                       ,iVar18,"fatal error");
          case 0x12:
            if (bVar19 != 0) {
              pgVar10 = ggml_repeat_back(ctx_compute,pgVar10,key);
              goto LAB_0012692e;
            }
            break;
          case 0x17:
            if (bVar19 != 0) {
              pgVar10 = ggml_rms_norm_back(ctx_compute,pgVar10,key,(float)pgVar12->op_params[0]);
              goto LAB_0012692e;
            }
            break;
          case 0x1b:
            if (bVar19 != 0) {
              if (pgVar10->ne[2] != key_00->ne[2]) {
                pcVar15 = "grad->ne[2] == src1->ne[2]";
                iVar18 = 0x1557;
                goto LAB_00127195;
              }
              local_90 = CONCAT44(local_90._4_4_,(int)in_R8);
              if (pgVar10->ne[3] != key_00->ne[3]) {
                pcVar15 = "grad->ne[3] == src1->ne[3]";
                iVar18 = 0x1558;
                goto LAB_00127195;
              }
              pgVar12 = ggml_out_prod(ctx_compute,key_00,pgVar10);
              _Var6 = ggml_are_same_shape(pgVar12,key);
              if (!_Var6) {
                if (pgVar12->ne[0] != key->ne[0]) {
                  pcVar15 = "tmp->ne[0] == src0->ne[0]";
                  iVar18 = 0x155e;
                  goto LAB_00127195;
                }
                if (pgVar12->ne[1] != key->ne[1]) {
                  pcVar15 = "tmp->ne[1] == src0->ne[1]";
                  iVar18 = 0x155f;
                  goto LAB_00127195;
                }
                if (pgVar12->ne[3] != 1) {
                  pcVar15 = "tmp->ne[3] == 1";
                  iVar18 = 0x1560;
                  goto LAB_00127195;
                }
                lVar24 = pgVar12->ne[2] / key->ne[2];
                pgVar12 = ggml_view_4d(ctx_compute,pgVar12,pgVar12->ne[0],pgVar12->ne[1],key->ne[2],
                                       lVar24,pgVar12->nb[1],pgVar12->nb[2] * lVar24,pgVar12->nb[2],
                                       0);
                pgVar12 = ggml_repeat_back(ctx_compute,pgVar12,key);
              }
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar12);
              in_R8 = local_90 & 0xffffffff;
            }
            uVar16 = (uint)in_R8;
            if (local_c4 != 0) {
              pgVar12 = ggml_transpose(ctx_compute,pgVar10);
              pgVar12 = ggml_out_prod(ctx_compute,key,pgVar12);
              goto LAB_00126b0e;
            }
            goto switchD_00125dbd_caseD_0;
          case 0x1e:
            if (bVar19 != 0) {
              pgVar10 = ggml_scale_impl(ctx_compute,pgVar10,(float)pgVar12->op_params[0],false);
              goto LAB_0012692e;
            }
            break;
          case 0x1f:
            iVar18 = pgVar12->op_params[0];
            iVar2 = pgVar12->op_params[1];
            iVar3 = pgVar12->op_params[2];
            iVar4 = pgVar12->op_params[3];
            local_90 = CONCAT44(local_90._4_4_,(int)in_R8);
            if (((bVar19 | local_c4) & 1) == 0) {
              pgVar12 = (ggml_tensor *)0x0;
            }
            else {
              if (key->type != pgVar12->type) {
                pcVar15 = "src0->type == tensor->type";
                iVar18 = 0x158b;
                goto LAB_00127195;
              }
              pgVar12 = cgraph->grads[isrc];
              if ((pgVar12 != (ggml_tensor *)0x0) && (pgVar12->type != pgVar10->type)) {
                pcVar15 = "!cgraph->grads[isrc0] || cgraph->grads[isrc0]->type == grad->type";
                iVar18 = 0x158c;
                goto LAB_00127195;
              }
              pgVar12 = cgraph->grads[local_a0];
              if (((pgVar12 != (ggml_tensor *)0x0 & local_c4) == 1) &&
                 (pgVar12->type != pgVar10->type)) {
                pcVar15 = 
                "!cgraph->grads[isrc1] || !src1_needs_grads || cgraph->grads[isrc1]->type == grad->type"
                ;
                iVar18 = 0x158d;
                goto LAB_00127195;
              }
              pgVar12 = ggml_view_4d(ctx_compute,pgVar10,key_00->ne[0],key_00->ne[1],key_00->ne[2],
                                     key_00->ne[3],(long)iVar18,(long)iVar2,(long)iVar3,(long)iVar4)
              ;
              in_R8 = local_90 & 0xffffffff;
            }
            if ((char)in_R8 != '\0') {
              pgVar13 = ggml_neg(ctx_compute,pgVar12);
              pgVar10 = ggml_acc_impl(ctx_compute,pgVar10,pgVar13,(long)iVar18,(long)iVar2,
                                      (long)iVar3,(long)iVar4,false);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
              in_R8 = local_90 & 0xffffffff;
            }
            if (local_c4 != 0) {
              uVar16 = (uint)in_R8;
              pgVar12 = ggml_cont(ctx_compute,pgVar12);
              pgVar12 = ggml_reshape(ctx_compute,pgVar12,key_00);
              goto LAB_00126b0e;
            }
            goto switchD_00125dbd_caseD_0;
          case 0x21:
            if (bVar19 != 0) {
              if ((cgraph->grads[isrc] == (ggml_tensor *)0x0) ||
                 (_Var6 = ggml_is_contiguous_0(cgraph->grads[isrc]), _Var6)) {
                _Var6 = ggml_is_contiguous_0(pgVar10);
                if (_Var6) {
                  if (pgVar12->ne[1] * pgVar12->ne[0] * pgVar12->ne[2] * pgVar12->ne[3] -
                      key->ne[1] * key->ne[0] * key->ne[2] * key->ne[3] == 0) {
                    _Var6 = ggml_are_same_shape(pgVar12,key);
                    if (!_Var6) {
                      pgVar10 = ggml_reshape(ctx_compute,pgVar10,key);
                    }
LAB_00126bcc:
                    ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar10);
                    goto LAB_00126b30;
                  }
                  pcVar15 = "ggml_nelements(tensor) == ggml_nelements(src0)";
                  iVar18 = 0x15ae;
                }
                else {
                  pcVar15 = "ggml_is_contiguous(grad)";
                  iVar18 = 0x15ad;
                }
              }
              else {
                pcVar15 = "!cgraph->grads[isrc0] || ggml_is_contiguous(cgraph->grads[isrc0])";
                iVar18 = 0x15ac;
              }
              goto LAB_00127195;
            }
            break;
          case 0x22:
            if (bVar19 != 0) {
              _Var6 = ggml_is_contiguous_0(pgVar10);
              if (!_Var6) {
                pgVar10 = ggml_cont(ctx_compute,pgVar10);
              }
              pgVar10 = ggml_reshape(ctx_compute,pgVar10,key);
              goto LAB_00126bcc;
            }
            break;
          case 0x23:
            if (bVar19 != 0) {
              uVar21 = *(ulong *)pgVar12->op_params;
              nb1 = pgVar12->nb[1];
              in_R8 = pgVar12->nb[2];
              nb3 = pgVar12->nb[3];
              pgVar12 = cgraph->grads[isrc];
              if (pgVar12 == (ggml_tensor *)0x0) {
                pgVar12 = (cgraph->visited_hash_set).keys[isrc];
                local_90 = nb3;
                if (pgVar12 == (ggml_tensor *)0x0) goto LAB_00127000;
                pgVar12 = ggml_scale(ctx_compute,pgVar12,0.0);
                bVar25 = false;
                nb3 = local_90;
              }
              else {
                if (key->type != pgVar12->type) {
                  uVar5 = type_traits[key->type].type_size;
                  if (uVar21 % uVar5 != 0) {
                    pcVar15 = "offset % n0 == 0";
                    iVar18 = 0x15c7;
                    goto LAB_00127195;
                  }
                  if (nb1 % uVar5 != 0) {
                    pcVar15 = "nb1 % n0 == 0";
                    iVar18 = 0x15c8;
                    goto LAB_00127195;
                  }
                  if (in_R8 % uVar5 != 0) {
                    pcVar15 = "nb2 % n0 == 0";
                    iVar18 = 0x15c9;
                    goto LAB_00127195;
                  }
                  if (nb3 % uVar5 != 0) {
                    pcVar15 = "nb3 % n0 == 0";
                    iVar18 = 0x15ca;
                    goto LAB_00127195;
                  }
                  sVar11 = type_traits[pgVar12->type].type_size;
                  uVar21 = (uVar21 / uVar5) * sVar11;
                  nb1 = (nb1 / uVar5) * sVar11;
                  in_R8 = (in_R8 / uVar5) * sVar11;
                  nb3 = (nb3 / uVar5) * sVar11;
                }
                if ((cgraph->visited_hash_set).keys[isrc] == (ggml_tensor *)0x0) {
LAB_00127000:
                  pcVar15 = "src";
                  iVar18 = 0x1487;
                  goto LAB_00127195;
                }
                bVar25 = cgraph->grad_accs[isrc] != (ggml_tensor *)0x0;
              }
              pgVar12 = ggml_acc_impl(ctx_compute,pgVar12,pgVar10,nb1,in_R8,nb3,uVar21,bVar25);
              cgraph->grads[isrc] = pgVar12;
              ggml_format_name(cgraph->grads[isrc],"grad for %s",
                               (cgraph->visited_hash_set).keys[isrc]->name);
              ggml_build_forward_expand(cgraph,cgraph->grads[isrc]);
              goto LAB_00126b30;
            }
            break;
          case 0x24:
            if (bVar19 != 0) {
              uVar16 = pgVar12->op_params[2];
              uVar7 = pgVar12->op_params[3];
              ignore_src[0] = false;
              ignore_src[1] = false;
              ignore_src[2] = false;
              ignore_src[3] = false;
              ignore_src[4] = false;
              ignore_src[5] = false;
              ignore_src[6] = false;
              ignore_src[7] = false;
              stack0xffffffffffffff80 = 0;
              p_Var1 = ignore_src + (ulong)(pgVar12->op_params[1] & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              p_Var1 = ignore_src + (ulong)(uVar16 & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              p_Var1 = ignore_src + (ulong)(uVar7 & 3) * 4;
              p_Var1[0] = true;
              p_Var1[1] = false;
              p_Var1[2] = false;
              p_Var1[3] = false;
              in_R8 = stack0xffffffffffffff80 & 0xffffffff;
              pgVar10 = ggml_permute(ctx_compute,pgVar10,ignore_src._0_4_,ignore_src._4_4_,
                                     stack0xffffffffffffff80,iStack_7c);
              goto LAB_0012692e;
            }
            break;
          case 0x25:
            if (bVar19 != 0) {
              pgVar10 = ggml_transpose(ctx_compute,pgVar10);
              goto LAB_0012692e;
            }
            break;
          case 0x26:
            if (bVar19 != 0) {
              pgVar10 = ggml_get_rows_back(ctx_compute,pgVar10,key_00,key);
              goto LAB_0012692e;
            }
            break;
          case 0x29:
          case 0x2a:
            if (bVar19 != 0) {
              pgVar10 = ggml_diag_mask_zero_impl(ctx_compute,pgVar10,pgVar12->op_params[0],false);
              goto LAB_0012692e;
            }
            break;
          case 0x2b:
            if (bVar19 != 0) {
              pgVar12 = ggml_soft_max_ext_back
                                  (ctx_compute,pgVar10,pgVar12,(float)pgVar12->op_params[0],
                                   (float)pgVar12->op_params[1]);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar12);
              in_R8 = in_R8 & 0xffffffff;
            }
            if ((key_00 != (ggml_tensor *)0x0 & local_c4) != 1) goto switchD_00125dbd_caseD_0;
            pcVar15 = 
            "(!src1 || !src1_needs_grads) && \"backward pass for softmax mask not implemented\"";
            iVar18 = 0x1608;
            goto LAB_00127195;
          case 0x2d:
            if (bVar19 != 0) {
              in_R8 = in_R8 & 0xffffffff;
              ignore_src._0_8_ = *(undefined8 *)(pgVar12->op_params + 0xb);
              unique0x10000c71 = *(ulong *)(pgVar12->op_params + 0xd);
              if (pgVar10->ne[2] == key_00->ne[0]) {
                pgVar12 = ggml_rope_ext_back(ctx_compute,pgVar10,key_00,key_01,pgVar12->op_params[1]
                                             ,pgVar12->op_params[2],pgVar12->op_params[4],
                                             (float)pgVar12->op_params[5],
                                             (float)pgVar12->op_params[6],
                                             (float)pgVar12->op_params[7],
                                             (float)pgVar12->op_params[8],
                                             (float)pgVar12->op_params[9],
                                             (float)pgVar12->op_params[10]);
              }
              else {
                pgVar12 = ggml_rope_multi_back
                                    (ctx_compute,pgVar10,key_00,key_01,pgVar12->op_params[1],
                                     (int *)ignore_src,pgVar12->op_params[2],pgVar12->op_params[4],
                                     (float)pgVar12->op_params[5],(float)pgVar12->op_params[6],
                                     (float)pgVar12->op_params[7],(float)pgVar12->op_params[8],
                                     (float)pgVar12->op_params[9],(float)pgVar12->op_params[10]);
              }
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar12);
            }
            if ((key_01 != (ggml_tensor *)0x0 & (byte)local_94) != 1) goto switchD_00125dbd_caseD_0;
            pcVar15 = 
            "(!src2 || !src2_needs_grads) && \"gradients for freq factors not implemented\"";
            iVar18 = 0x1623;
            goto LAB_00127195;
          case 0x31:
            if (local_c4 != 0) {
              pgVar12 = ggml_im2col_back(ctx_compute,pgVar10,key,key_00->ne,pgVar12->op_params[0],
                                         pgVar12->op_params[1],pgVar12->op_params[2],
                                         pgVar12->op_params[3],pgVar12->op_params[4],
                                         pgVar12->op_params[5],pgVar12->op_params[6] == 1);
              goto LAB_001265ac;
            }
            goto switchD_00125dbd_caseD_0;
          case 0x36:
            if (bVar19 != 0) {
              in_R8 = (ulong)(uint)pgVar12->op_params[1];
              pgVar10 = ggml_pool_2d_back(ctx_compute,pgVar10,key,pgVar12->op_params[0],
                                          pgVar12->op_params[1],pgVar12->op_params[2],
                                          pgVar12->op_params[3],pgVar12->op_params[4],
                                          (float)pgVar12->op_params[5],(float)pgVar12->op_params[6])
              ;
              goto LAB_0012692e;
            }
            break;
          case 0x43:
          case 0x44:
          case 0x4a:
            in_R8 = in_R8 & 0xffffffff;
            gVar8 = ggml_get_unary_op(pgVar12);
            __stream = _stderr;
            cVar20 = (char)in_R8;
            pgVar13 = pgVar10;
            switch(gVar8) {
            case GGML_UNARY_OP_ABS:
              if (cVar20 != '\0') {
                pgVar12 = ggml_sgn(ctx_compute,key);
LAB_00126919:
                pgVar10 = ggml_mul(ctx_compute,pgVar12,pgVar13);
                goto LAB_0012692e;
              }
              break;
            case GGML_UNARY_OP_SGN:
            case GGML_UNARY_OP_STEP:
              goto switchD_00125dbd_caseD_0;
            case GGML_UNARY_OP_NEG:
              if (cVar20 != '\0') goto LAB_001268ea;
              break;
            default:
              gVar8 = ggml_get_unary_op(pgVar12);
              fprintf(__stream,"%s: unsupported unary op for backward pass: %s\n",
                      "ggml_compute_backward",GGML_UNARY_OP_NAME[gVar8]);
              iVar18 = 0x1665;
              goto LAB_00127069;
            case GGML_UNARY_OP_RELU:
              if (cVar20 != '\0') {
                pgVar12 = ggml_step(ctx_compute,key);
                goto LAB_00126919;
              }
              break;
            case GGML_UNARY_OP_SILU:
              if (cVar20 != '\0') {
                pgVar10 = ggml_silu_back(ctx_compute,pgVar10,key);
                goto LAB_0012692e;
              }
              break;
            case GGML_UNARY_OP_EXP:
              if (cVar20 != '\0') goto LAB_00126919;
            }
            break;
          case 0x4f:
            if (bVar19 != 0) {
              pgVar12 = ggml_cross_entropy_loss_back(ctx_compute,pgVar10,key,key_00);
              ggml_add_or_set(ctx_compute,cgraph,isrc,pgVar12);
              in_R8 = in_R8 & 0xffffffff;
            }
            if (local_c4 != 0) {
              pcVar15 = "!src1_needs_grads && \"backward pass for labels not implemented\"";
              iVar18 = 0x166d;
              goto LAB_00127195;
            }
switchD_00125dbd_caseD_0:
            if ((char)in_R8 != '\0') {
LAB_00126b30:
              _Var6 = ggml_are_same_shape(key,cgraph->grads[isrc]);
              if (!_Var6) {
                pcVar15 = "!src0_needs_grads || ggml_are_same_shape(src0, cgraph->grads[isrc0])";
                iVar18 = 0x1679;
                goto LAB_00127195;
              }
            }
          }
          if ((local_c4 != 0) &&
             (_Var6 = ggml_are_same_shape(key_00,cgraph->grads[local_a0]), !_Var6)) {
            pcVar15 = "!src1_needs_grads || ggml_are_same_shape(src1, cgraph->grads[isrc1])";
            iVar18 = 0x167a;
            goto LAB_00127195;
          }
          if (((byte)local_94 != '\0') &&
             (_Var6 = ggml_are_same_shape(key_01,cgraph->grads[sVar9]), !_Var6)) {
            pcVar15 = "!src2_needs_grads || ggml_are_same_shape(src2, cgraph->grads[isrc2])";
            iVar18 = 0x167b;
            goto LAB_00127195;
          }
LAB_00126ba3:
          lVar22 = lVar22 + -1;
        } while( true );
      }
      pcVar15 = "any_loss && \"no training loss found, did you forget to call ggml_set_loss?\"";
      iVar18 = 0x16d3;
    }
  }
LAB_00127195:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",iVar18,
             "GGML_ASSERT(%s) failed",pcVar15);
}

Assistant:

void ggml_build_backward_expand(
        struct ggml_context * ctx_static,
        struct ggml_context * ctx_compute,
        struct ggml_cgraph  * cgraph,
        bool                  accumulate) {
    GGML_ASSERT(cgraph->n_nodes > 0);
    GGML_ASSERT(cgraph->grads);
    GGML_ASSERT(cgraph->grad_accs);

    const int n_nodes_f = cgraph->n_nodes;

    memset(cgraph->grads,     0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    memset(cgraph->grad_accs, 0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    bool * grads_needed = calloc(cgraph->visited_hash_set.size, sizeof(bool));

    {
        bool any_params = false;
        bool any_loss   = false;
        for (int i = 0; i < n_nodes_f; ++i) {
            struct ggml_tensor * node = cgraph->nodes[i];
            any_params = any_params || (node->flags & GGML_TENSOR_FLAG_PARAM);
            any_loss   = any_loss   || (node->flags & GGML_TENSOR_FLAG_LOSS);
        }
        GGML_ASSERT(any_params && "no trainable parameters found, did you forget to call ggml_set_param?");
        GGML_ASSERT(any_loss && "no training loss found, did you forget to call ggml_set_loss?");
    }

    for (int i = 0; i < n_nodes_f; ++i) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (node->type == GGML_TYPE_I32) {
            continue;
        }

        bool node_needs_grad = (node->flags & GGML_TENSOR_FLAG_PARAM) || (node->flags & GGML_TENSOR_FLAG_LOSS);
        bool ignore_src[GGML_MAX_SRC] = {false};
        switch (node->op) {
            // gradients in node->src[0] for one reason or another have no effect on output gradients
            case GGML_OP_IM2COL:      // only used for its shape
            case GGML_OP_IM2COL_BACK: // same as IM2COL
                ignore_src[0] = true;
                break;
            case GGML_OP_UNARY: {
                const enum ggml_unary_op uop = ggml_get_unary_op(node);
                // SGN and STEP unary ops are piecewise constant
                if (uop == GGML_UNARY_OP_SGN || uop == GGML_UNARY_OP_STEP) {
                    ignore_src[0] = true;
                }
            } break;

            // gradients in node->src[1] for one reason or another have no effect on output gradients
            case GGML_OP_CPY:           // gradients in CPY target are irrelevant
            case GGML_OP_GET_ROWS:      // row indices not differentiable
            case GGML_OP_GET_ROWS_BACK: // same as for GET_ROWS
            case GGML_OP_ROPE:          // positions not differentiable
                ignore_src[1] = true;
                break;

            default:
                break;
        }
        for (int j = 0; j < GGML_MAX_SRC; ++j) {
            if (!node->src[j] || ignore_src[j] || !grads_needed[ggml_hash_find(&cgraph->visited_hash_set, node->src[j])]) {
                continue;
            }
            GGML_ASSERT(node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16);
            node_needs_grad = true;
            break;
        }
        if (!node_needs_grad) {
            continue;
        }

        // inplace operations are currently not supported
        GGML_ASSERT(!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW ||
            node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE);

        const size_t igrad = ggml_hash_find(&cgraph->visited_hash_set, node);
        GGML_ASSERT(igrad != GGML_HASHSET_FULL);
        GGML_ASSERT(ggml_bitset_get(cgraph->visited_hash_set.used, igrad));
        if ((accumulate && (node->flags & GGML_TENSOR_FLAG_PARAM)) || (node->flags & GGML_TENSOR_FLAG_LOSS)) {
            cgraph->grad_accs[igrad] = ggml_dup_tensor(ctx_static, node);
            cgraph->grads[igrad]     = cgraph->grad_accs[igrad];
            ggml_format_name(cgraph->grad_accs[igrad], "grad acc for %s", node->name);
        }
        grads_needed[igrad] = true;
    }

    for (int i = n_nodes_f - 1; i >= 0; --i) {
        // inplace operations to add gradients are not created by ggml_compute_backward except for gradient accumulation
        // use allocator to automatically make inplace operations
        ggml_compute_backward(ctx_compute, cgraph, i, grads_needed);
    }

    free(grads_needed);
}